

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O3

Fraig_Node_t * Fraig_HashTableLookupF0(Fraig_Man_t *pMan,Fraig_Node_t *pNode)

{
  Fraig_HashTable_t *p;
  Fraig_Node_t **ppFVar1;
  int iVar2;
  uint uVar3;
  Fraig_Node_t *pNode2;
  ulong uVar4;
  
  p = pMan->pTableF0;
  uVar3 = p->nBins;
  uVar4 = (ulong)pNode->uHashD % (ulong)uVar3;
  pNode2 = p->pBins[uVar4];
  if (pNode2 != (Fraig_Node_t *)0x0) {
    do {
      iVar2 = Fraig_CompareSimInfo(pNode,pNode2,pMan->iWordStart,0);
      if (iVar2 != 0) {
        return pNode2;
      }
      pNode2 = pNode2->pNextF;
    } while (pNode2 != (Fraig_Node_t *)0x0);
    uVar3 = p->nBins;
  }
  iVar2 = p->nEntries;
  if (SBORROW4(iVar2,uVar3 * 2) == (int)(iVar2 + uVar3 * -2) < 0) {
    Fraig_TableResizeF(p,0);
    uVar4 = (ulong)pNode->uHashD % (ulong)(uint)p->nBins;
    iVar2 = p->nEntries;
  }
  ppFVar1 = p->pBins;
  pNode->pNextF = ppFVar1[uVar4];
  ppFVar1[uVar4] = pNode;
  p->nEntries = iVar2 + 1;
  return (Fraig_Node_t *)0x0;
}

Assistant:

Fraig_Node_t * Fraig_HashTableLookupF0( Fraig_Man_t * pMan, Fraig_Node_t * pNode )
{
    Fraig_HashTable_t * p = pMan->pTableF0;
    Fraig_Node_t * pEnt;
    unsigned Key;

    // go through the hash table entries
    Key = pNode->uHashD % p->nBins;
    Fraig_TableBinForEachEntryF( p->pBins[Key], pEnt )
    {
        // if their simulation info differs, skip
        if ( !Fraig_CompareSimInfo( pNode, pEnt, pMan->iWordStart, 0 ) )
            continue;
        // found a simulation-equivalent node
        return pEnt; 
    }

    // check if it is a good time for table resizing
    if ( p->nEntries >= 2 * p->nBins )
    {
        Fraig_TableResizeF( p, 0 );
        Key = pNode->uHashD % p->nBins;
    }

    // add the node to the corresponding linked list in the table
    pNode->pNextF = p->pBins[Key];
    p->pBins[Key] = pNode;
    p->nEntries++;
    // return NULL, because there is no functional equivalence in this case
    return NULL;
}